

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O0

void __thiscall bitfoot::Bitfoot::Initialize(Bitfoot *this)

{
  int64_t iVar1;
  Bitfoot *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  undefined1 local_38 [44];
  int i;
  Bitfoot *this_local;
  
  this->ply = 0;
  this->child = (Bitfoot *)_node;
  this->parent = (Bitfoot *)0x0;
  for (local_38._36_4_ = 0; (int)local_38._36_4_ < 100; local_38._36_4_ = local_38._36_4_ + 1) {
    *(int *)(_node + (long)(int)local_38._36_4_ * 0xbe8 + 0x40) = local_38._36_4_ + 1;
    if (local_38._36_4_ + 1 < 100) {
      local_e8 = _node + (long)(local_38._36_4_ + 1) * 0xbe8;
    }
    else {
      local_e8 = (undefined1 *)0x0;
    }
    *(undefined1 **)(_node + (long)(int)local_38._36_4_ * 0xbe8 + 0x38) = local_e8;
    local_f0 = this;
    if (0 < (int)local_38._36_4_) {
      local_f0 = (Bitfoot *)(_node + (long)(local_38._36_4_ + -1) * 0xbe8);
    }
    *(Bitfoot **)(_node + (long)(int)local_38._36_4_ * 0xbe8 + 0x30) = local_f0;
  }
  unique0x1000038e = this;
  _hashSize = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
  _contempt = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
  _delta = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
  _futility = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
  _rzr = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
  _tempo = (undefined4)iVar1;
  iVar1 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
  _test = (undefined4)iVar1;
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_38);
  _ext = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_38);
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_58);
  _iid = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_58);
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_78);
  _lmr = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_78);
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_98);
  _nmp = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_98);
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_b8);
  _nmr = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_b8);
  senjo::EngineOption::GetValue_abi_cxx11_((EngineOption *)local_d8);
  _oneReply = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)_TRUE_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_d8);
  ClearHistory(this);
  SetHashSize(this,_hashSize);
  (*(this->super_ChessEngine)._vptr_ChessEngine[9])(this,senjo::ChessEngine::_STARTPOS);
  _initialized = 1;
  return;
}

Assistant:

void Bitfoot::Initialize()
{
  ply = 0;
  child = _node;
  parent = NULL;
  for (int i = 0; i < MaxPlies; ++i) {
    _node[i].ply = (i + 1);
    _node[i].child = ((i + 1) < MaxPlies) ? &(_node[i + 1]) : NULL;
    _node[i].parent = (i > 0) ? &(_node[i - 1]) : this;
  }

  _hashSize = _optHash.GetIntValue();
  _contempt = static_cast<int>(_optContempt.GetIntValue());
  _delta    = static_cast<int>(_optDelta.GetIntValue());
  _futility = static_cast<int>(_optFutility.GetIntValue());
  _rzr      = static_cast<int>(_optRZR.GetIntValue());
  _tempo    = static_cast<int>(_optTempo.GetIntValue());
  _test     = static_cast<int>(_optTest.GetIntValue());
  _ext      = (_optEXT.GetValue() == _TRUE);
  _iid      = (_optIID.GetValue() == _TRUE);
  _lmr      = (_optLMR.GetValue() == _TRUE);
  _nmp      = (_optNMP.GetValue() == _TRUE);
  _nmr      = (_optNMR.GetValue() == _TRUE);
  _oneReply = (_optOneReply.GetValue() == _TRUE);

  ClearHistory();
  SetHashSize(_hashSize);
  SetPosition(_STARTPOS);

  _initialized = true;
}